

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::set(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      *this,ConfigData *obj,string *stringValue)

{
  undefined8 in_RSI;
  string *in_RDI;
  type value;
  string *_source;
  string local_38;
  undefined8 local_10;
  
  _source = &local_38;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)_source);
  convertInto(_source,in_RDI);
  (*(code *)in_RDI->_M_string_length)(local_10,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void set( C& obj, std::string const& stringValue ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( stringValue, value );
                function( obj, value );
            }